

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_set_rd_speed_thresholds(AV1_COMP *cpi)

{
  memset(&cpi->rd,0,0x2a4);
  (cpi->rd).thresh_mult[0] = 300;
  (cpi->rd).thresh_mult[1] = 300;
  (cpi->rd).thresh_mult[2] = 300;
  (cpi->rd).thresh_mult[3] = 300;
  (cpi->rd).thresh_mult[4] = 300;
  (cpi->rd).thresh_mult[5] = 300;
  (cpi->rd).thresh_mult[6] = 300;
  (cpi->rd).thresh_mult[7] = 1000;
  (cpi->rd).thresh_mult[8] = 1000;
  (cpi->rd).thresh_mult[9] = 1000;
  (cpi->rd).thresh_mult[10] = 1000;
  (cpi->rd).thresh_mult[0xb] = 0x44c;
  (cpi->rd).thresh_mult[0xc] = 1000;
  (cpi->rd).thresh_mult[0xd] = 1000;
  (cpi->rd).thresh_mult[0xe] = 1000;
  (cpi->rd).thresh_mult[0xf] = 1000;
  (cpi->rd).thresh_mult[0x10] = 1000;
  (cpi->rd).thresh_mult[0x11] = 1000;
  (cpi->rd).thresh_mult[0x12] = 1000;
  (cpi->rd).thresh_mult[0x13] = 1000;
  (cpi->rd).thresh_mult[0x14] = 1000;
  (cpi->rd).thresh_mult[0x15] = 0x898;
  (cpi->rd).thresh_mult[0x16] = 2000;
  (cpi->rd).thresh_mult[0x17] = 2000;
  (cpi->rd).thresh_mult[0x18] = 0x960;
  (cpi->rd).thresh_mult[0x19] = 2000;
  (cpi->rd).thresh_mult[0x1a] = 0x960;
  (cpi->rd).thresh_mult[0x1b] = 2000;
  (cpi->rd).thresh_mult[0x1c] = 0x44c;
  (cpi->rd).thresh_mult[0x1d] = 1000;
  (cpi->rd).thresh_mult[0x1e] = 800;
  (cpi->rd).thresh_mult[0x1f] = 900;
  (cpi->rd).thresh_mult[0x20] = 1000;
  (cpi->rd).thresh_mult[0x21] = 1000;
  (cpi->rd).thresh_mult[0x22] = 1000;
  (cpi->rd).thresh_mult[0x23] = 1000;
  (cpi->rd).thresh_mult[0x24] = 1000;
  (cpi->rd).thresh_mult[0x25] = 1000;
  (cpi->rd).thresh_mult[0x26] = 1000;
  (cpi->rd).thresh_mult[0x27] = 1000;
  (cpi->rd).thresh_mult[0x28] = 2000;
  (cpi->rd).thresh_mult[0x29] = 2000;
  (cpi->rd).thresh_mult[0x2a] = 2000;
  (cpi->rd).thresh_mult[0x2b] = 2000;
  (cpi->rd).thresh_mult[0x34] = 0x960;
  (cpi->rd).thresh_mult[0x35] = 0x5dc;
  (cpi->rd).thresh_mult[0x36] = 0x5dc;
  (cpi->rd).thresh_mult[0x37] = 0x74e;
  (cpi->rd).thresh_mult[0x3c] = 0x5dc;
  (cpi->rd).thresh_mult[0x3d] = 0x5dc;
  (cpi->rd).thresh_mult[0x3e] = 0x6a4;
  (cpi->rd).thresh_mult[0x3f] = 0x74e;
  (cpi->rd).thresh_mult[0x38] = 0x5fa;
  (cpi->rd).thresh_mult[0x39] = 0xabe;
  (cpi->rd).thresh_mult[0x3a] = 0x4b0;
  (cpi->rd).thresh_mult[0x3b] = 0x708;
  (cpi->rd).thresh_mult[0x40] = 0x9c4;
  (cpi->rd).thresh_mult[0x41] = 0x4b0;
  (cpi->rd).thresh_mult[0x42] = 2000;
  (cpi->rd).thresh_mult[0x43] = 0x5dc;
  (cpi->rd).thresh_mult[0x44] = 0x5dc;
  (cpi->rd).thresh_mult[0x45] = 0x6a4;
  (cpi->rd).thresh_mult[0x46] = 0x6a4;
  (cpi->rd).thresh_mult[0x47] = 3000;
  (cpi->rd).thresh_mult[0x48] = 0x528;
  (cpi->rd).thresh_mult[0x49] = 2000;
  (cpi->rd).thresh_mult[0x4a] = 0x5dc;
  (cpi->rd).thresh_mult[0x4b] = 0x5dc;
  (cpi->rd).thresh_mult[0x2c] = 0x4b0;
  (cpi->rd).thresh_mult[0x2d] = 0x960;
  (cpi->rd).thresh_mult[0x2e] = 0x5dc;
  (cpi->rd).thresh_mult[0x2f] = 0x5dc;
  (cpi->rd).thresh_mult[0x30] = 0x6a4;
  (cpi->rd).thresh_mult[0x31] = 0x550;
  (cpi->rd).thresh_mult[0x32] = 0x8ca;
  (cpi->rd).thresh_mult[0x33] = 0x4b0;
  (cpi->rd).thresh_mult[0x4c] = 0x6a4;
  (cpi->rd).thresh_mult[0x4d] = 0x7f8;
  (cpi->rd).thresh_mult[0x4e] = 0x8ca;
  (cpi->rd).thresh_mult[0x4f] = 0x4b0;
  (cpi->rd).thresh_mult[0x50] = 2000;
  (cpi->rd).thresh_mult[0x51] = 0x5dc;
  (cpi->rd).thresh_mult[0x52] = 0x5dc;
  (cpi->rd).thresh_mult[0x53] = 0x6a4;
  (cpi->rd).thresh_mult[0x58] = 0x5dc;
  (cpi->rd).thresh_mult[0x59] = 0x5dc;
  (cpi->rd).thresh_mult[0x5a] = 0x6a4;
  (cpi->rd).thresh_mult[0x5b] = 0x74e;
  (cpi->rd).thresh_mult[0x54] = 0x6a4;
  (cpi->rd).thresh_mult[0x55] = 0x9c4;
  (cpi->rd).thresh_mult[0x56] = 0x4b0;
  (cpi->rd).thresh_mult[0x57] = 2000;
  (cpi->rd).thresh_mult[0x5c] = 0x9c4;
  (cpi->rd).thresh_mult[0x5d] = 0x4b0;
  (cpi->rd).thresh_mult[0x5e] = 2000;
  (cpi->rd).thresh_mult[0x5f] = 0x5dc;
  (cpi->rd).thresh_mult[0x60] = 0x5dc;
  (cpi->rd).thresh_mult[0x61] = 0x6a4;
  (cpi->rd).thresh_mult[0x62] = 0x6a4;
  (cpi->rd).thresh_mult[99] = 0x9c4;
  (cpi->rd).thresh_mult[100] = 0x4b0;
  (cpi->rd).thresh_mult[0x65] = 2000;
  (cpi->rd).thresh_mult[0x66] = 0x5dc;
  (cpi->rd).thresh_mult[0x67] = 0x708;
  (cpi->rd).thresh_mult[0x68] = 0x6a4;
  (cpi->rd).thresh_mult[0x69] = 0x6a4;
  (cpi->rd).thresh_mult[0x6a] = 0x9c4;
  (cpi->rd).thresh_mult[0x6b] = 0x4b0;
  (cpi->rd).thresh_mult[0x6c] = 2000;
  (cpi->rd).thresh_mult[0x6d] = 0x5dc;
  (cpi->rd).thresh_mult[0x6e] = 0x5dc;
  (cpi->rd).thresh_mult[0x6f] = 0x6a4;
  (cpi->rd).thresh_mult[0x74] = 0x5dc;
  (cpi->rd).thresh_mult[0x75] = 0x5dc;
  (cpi->rd).thresh_mult[0x76] = 0x6a4;
  (cpi->rd).thresh_mult[0x77] = 0x6a4;
  (cpi->rd).thresh_mult[0x70] = 0x6a4;
  (cpi->rd).thresh_mult[0x71] = 0x9c4;
  (cpi->rd).thresh_mult[0x72] = 0x5a0;
  (cpi->rd).thresh_mult[0x73] = 2000;
  (cpi->rd).thresh_mult[0x78] = 0x9c4;
  (cpi->rd).thresh_mult[0x79] = 0x4b0;
  (cpi->rd).thresh_mult[0x7a] = 2000;
  (cpi->rd).thresh_mult[0x7b] = 0x5dc;
  (cpi->rd).thresh_mult[0x7c] = 0x5dc;
  (cpi->rd).thresh_mult[0x7d] = 0x6a4;
  (cpi->rd).thresh_mult[0x7e] = 0x6a4;
  (cpi->rd).thresh_mult[0x7f] = 0xabe;
  (cpi->rd).thresh_mult[0x80] = 0x640;
  (cpi->rd).thresh_mult[0x81] = 0x960;
  (cpi->rd).thresh_mult[0x82] = 2000;
  (cpi->rd).thresh_mult[0x83] = 2000;
  (cpi->rd).thresh_mult[0x84] = 0x898;
  (cpi->rd).thresh_mult[0x85] = 0xa50;
  (cpi->rd).thresh_mult[0x86] = 0xc80;
  (cpi->rd).thresh_mult[0x87] = 0x640;
  (cpi->rd).thresh_mult[0x88] = 0x960;
  (cpi->rd).thresh_mult[0x89] = 0x708;
  (cpi->rd).thresh_mult[0x8a] = 2000;
  (cpi->rd).thresh_mult[0x8b] = 0x898;
  (cpi->rd).thresh_mult[0x90] = 2000;
  (cpi->rd).thresh_mult[0x91] = 0x960;
  (cpi->rd).thresh_mult[0x92] = 0xa50;
  (cpi->rd).thresh_mult[0x93] = 0x6e0;
  (cpi->rd).thresh_mult[0x8c] = 0x898;
  (cpi->rd).thresh_mult[0x8d] = 0xc80;
  (cpi->rd).thresh_mult[0x8e] = 0x6e0;
  (cpi->rd).thresh_mult[0x8f] = 0x960;
  (cpi->rd).thresh_mult[0x94] = 0xc80;
  (cpi->rd).thresh_mult[0x95] = 0x640;
  (cpi->rd).thresh_mult[0x96] = 0xa50;
  (cpi->rd).thresh_mult[0x97] = 2000;
  (cpi->rd).thresh_mult[0x98] = 2000;
  (cpi->rd).thresh_mult[0x99] = 0x7bc;
  (cpi->rd).thresh_mult[0x9a] = 0x898;
  (cpi->rd).thresh_mult[0x9b] = 0xc80;
  (cpi->rd).thresh_mult[0x9c] = 1000;
  (cpi->rd).thresh_mult[0x9d] = 1000;
  (cpi->rd).thresh_mult[0x9e] = 0x898;
  (cpi->rd).thresh_mult[0x9f] = 2000;
  (cpi->rd).thresh_mult[0xa0] = 2000;
  (cpi->rd).thresh_mult[0xa1] = 2000;
  (cpi->rd).thresh_mult[0xa2] = 0x708;
  (cpi->rd).thresh_mult[0xa3] = 0x9c4;
  (cpi->rd).thresh_mult[0xa4] = 2000;
  (cpi->rd).thresh_mult[0xa5] = 0x9c4;
  (cpi->rd).thresh_mult[0xa6] = 2000;
  (cpi->rd).thresh_mult[0xa7] = 0x9c4;
  (cpi->rd).thresh_mult[0xa8] = 0x9c4;
  return;
}

Assistant:

void av1_set_rd_speed_thresholds(AV1_COMP *cpi) {
  RD_OPT *const rd = &cpi->rd;

  // Set baseline threshold values.
  av1_zero(rd->thresh_mult);

  rd->thresh_mult[THR_NEARESTMV] = 300;
  rd->thresh_mult[THR_NEARESTL2] = 300;
  rd->thresh_mult[THR_NEARESTL3] = 300;
  rd->thresh_mult[THR_NEARESTB] = 300;
  rd->thresh_mult[THR_NEARESTA2] = 300;
  rd->thresh_mult[THR_NEARESTA] = 300;
  rd->thresh_mult[THR_NEARESTG] = 300;

  rd->thresh_mult[THR_NEWMV] = 1000;
  rd->thresh_mult[THR_NEWL2] = 1000;
  rd->thresh_mult[THR_NEWL3] = 1000;
  rd->thresh_mult[THR_NEWB] = 1000;
  rd->thresh_mult[THR_NEWA2] = 1100;
  rd->thresh_mult[THR_NEWA] = 1000;
  rd->thresh_mult[THR_NEWG] = 1000;

  rd->thresh_mult[THR_NEARMV] = 1000;
  rd->thresh_mult[THR_NEARL2] = 1000;
  rd->thresh_mult[THR_NEARL3] = 1000;
  rd->thresh_mult[THR_NEARB] = 1000;
  rd->thresh_mult[THR_NEARA2] = 1000;
  rd->thresh_mult[THR_NEARA] = 1000;
  rd->thresh_mult[THR_NEARG] = 1000;

  rd->thresh_mult[THR_GLOBALMV] = 2200;
  rd->thresh_mult[THR_GLOBALL2] = 2000;
  rd->thresh_mult[THR_GLOBALL3] = 2000;
  rd->thresh_mult[THR_GLOBALB] = 2400;
  rd->thresh_mult[THR_GLOBALA2] = 2000;
  rd->thresh_mult[THR_GLOBALG] = 2000;
  rd->thresh_mult[THR_GLOBALA] = 2400;

  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLA] = 1100;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL2A] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL3A] = 800;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTGA] = 900;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLB] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL2B] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL3B] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTGB] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLA2] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL2A2] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL3A2] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTGA2] = 1000;

  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLL2] = 2000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLL3] = 2000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLG] = 2000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTBA] = 2000;

  rd->thresh_mult[THR_COMP_NEAR_NEARLA] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLA] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLA] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWLA] = 1530;
  rd->thresh_mult[THR_COMP_NEW_NEARLA] = 1870;
  rd->thresh_mult[THR_COMP_NEW_NEWLA] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLA] = 2750;

  rd->thresh_mult[THR_COMP_NEAR_NEARL2A] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL2A] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL2A] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL2A] = 1870;
  rd->thresh_mult[THR_COMP_NEW_NEARL2A] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL2A] = 1800;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL2A] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL3A] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL3A] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL3A] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL3A] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL3A] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL3A] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL3A] = 3000;

  rd->thresh_mult[THR_COMP_NEAR_NEARGA] = 1320;
  rd->thresh_mult[THR_COMP_NEAREST_NEWGA] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTGA] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWGA] = 2040;
  rd->thresh_mult[THR_COMP_NEW_NEARGA] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWGA] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALGA] = 2250;

  rd->thresh_mult[THR_COMP_NEAR_NEARLB] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLB] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLB] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWLB] = 1360;
  rd->thresh_mult[THR_COMP_NEW_NEARLB] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWLB] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLB] = 2250;

  rd->thresh_mult[THR_COMP_NEAR_NEARL2B] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL2B] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL2B] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL2B] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL2B] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL2B] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL2B] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL3B] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL3B] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL3B] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL3B] = 1870;
  rd->thresh_mult[THR_COMP_NEW_NEARL3B] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL3B] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL3B] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARGB] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWGB] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTGB] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWGB] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARGB] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWGB] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALGB] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARLA2] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLA2] = 1800;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLA2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWLA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARLA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWLA2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLA2] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL2A2] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL2A2] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL2A2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL2A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL2A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL2A2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL2A2] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL3A2] = 1440;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL3A2] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL3A2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL3A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL3A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL3A2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL3A2] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARGA2] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWGA2] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTGA2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWGA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARGA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWGA2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALGA2] = 2750;

  rd->thresh_mult[THR_COMP_NEAR_NEARLL2] = 1600;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLL2] = 2000;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLL2] = 2000;
  rd->thresh_mult[THR_COMP_NEAR_NEWLL2] = 2640;
  rd->thresh_mult[THR_COMP_NEW_NEARLL2] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEWLL2] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLL2] = 3200;

  rd->thresh_mult[THR_COMP_NEAR_NEARLL3] = 1600;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLL3] = 2000;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLL3] = 1800;
  rd->thresh_mult[THR_COMP_NEAR_NEWLL3] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEARLL3] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEWLL3] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLL3] = 3200;

  rd->thresh_mult[THR_COMP_NEAR_NEARLG] = 1760;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLG] = 2400;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLG] = 2000;
  rd->thresh_mult[THR_COMP_NEAR_NEWLG] = 1760;
  rd->thresh_mult[THR_COMP_NEW_NEARLG] = 2640;
  rd->thresh_mult[THR_COMP_NEW_NEWLG] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLG] = 3200;

  rd->thresh_mult[THR_COMP_NEAR_NEARBA] = 1600;
  rd->thresh_mult[THR_COMP_NEAREST_NEWBA] = 2000;
  rd->thresh_mult[THR_COMP_NEW_NEARESTBA] = 2000;
  rd->thresh_mult[THR_COMP_NEAR_NEWBA] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEARBA] = 1980;
  rd->thresh_mult[THR_COMP_NEW_NEWBA] = 2640;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALBA] = 3200;

  rd->thresh_mult[THR_DC] = 1000;
  rd->thresh_mult[THR_PAETH] = 1000;
  rd->thresh_mult[THR_SMOOTH] = 2200;
  rd->thresh_mult[THR_SMOOTH_V] = 2000;
  rd->thresh_mult[THR_SMOOTH_H] = 2000;
  rd->thresh_mult[THR_H_PRED] = 2000;
  rd->thresh_mult[THR_V_PRED] = 1800;
  rd->thresh_mult[THR_D135_PRED] = 2500;
  rd->thresh_mult[THR_D203_PRED] = 2000;
  rd->thresh_mult[THR_D157_PRED] = 2500;
  rd->thresh_mult[THR_D67_PRED] = 2000;
  rd->thresh_mult[THR_D113_PRED] = 2500;
  rd->thresh_mult[THR_D45_PRED] = 2500;
}